

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O2

bool __thiscall YAML::Utils::WriteTag(Utils *this,ostream_wrapper *out,string *str,bool verbatim)

{
  int iVar1;
  RegEx *this_00;
  undefined7 in_register_00000009;
  size_t __n;
  void *__buf;
  pointer pcVar2;
  char *pcVar3;
  pointer pcVar4;
  StringCharSource buffer;
  allocator local_55;
  int local_54;
  StringCharSource local_50;
  
  __n = CONCAT71(in_register_00000009,verbatim);
  iVar1 = (int)str;
  pcVar3 = "!";
  if (iVar1 != 0) {
    pcVar3 = "!<";
  }
  std::__cxx11::string::string((string *)&local_50,pcVar3,&local_55);
  ostream_wrapper::write((ostream_wrapper *)this,(int)&local_50,__buf,__n);
  std::__cxx11::string::~string((string *)&local_50);
  local_50.m_str =
       (out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  pcVar4 = (out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_50.m_offset = 0;
  local_54 = iVar1;
  local_50.m_size = (size_t)pcVar4;
  if ((char)str == '\0') {
    this_00 = Exp::Tag();
  }
  else {
    this_00 = Exp::URI();
  }
  pcVar2 = (pointer)0x0;
  while (pcVar2 < pcVar4) {
    iVar1 = RegEx::Match<YAML::StringCharSource>(this_00,&local_50);
    if (iVar1 < 1) goto LAB_0069e8f8;
    for (; pcVar2 = (pointer)local_50.m_offset, pcVar4 = (pointer)local_50.m_size, 0 < iVar1;
        iVar1 = iVar1 + -1) {
      YAML::operator<<((ostream_wrapper *)this,local_50.m_str[local_50.m_offset]);
      local_50.m_offset = local_50.m_offset + 1;
    }
  }
  if ((char)local_54 != '\0') {
    YAML::operator<<((ostream_wrapper *)this,(char (*) [2])0x6d15db);
  }
LAB_0069e8f8:
  return pcVar4 <= pcVar2;
}

Assistant:

bool WriteTag(ostream_wrapper& out, const std::string& str, bool verbatim) {
  out << (verbatim ? "!<" : "!");
  StringCharSource buffer(str.c_str(), str.size());
  const RegEx& reValid = verbatim ? Exp::URI() : Exp::Tag();
  while (buffer) {
    int n = reValid.Match(buffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << buffer[0];
      ++buffer;
    }
  }
  if (verbatim) {
    out << ">";
  }
  return true;
}